

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O2

void peer_udp_multicast_discovery(void)

{
  WaitResult<bool> WVar1;
  FindUserDataCallable find_peer2;
  Peer peer2;
  Peer peer1;
  FindUserDataCallable find_peer1;
  allocator local_141;
  undefined1 local_140 [40];
  PeerParameters local_118;
  Peer local_e8;
  Peer local_d0;
  undefined1 local_b8 [40];
  allocator local_90 [32];
  FindUserDataCallable local_70;
  FindUserDataCallable local_48;
  
  local_118.min_supported_protocol_version_ = kProtocolVersion1;
  local_118.max_supported_protocol_version_ = kProtocolVersion1;
  local_118.discovered_peer_ttl_ms_ = 10000;
  local_118.discover_self_ = false;
  local_118.same_peer_mode_ = kSamePeerIpAndPort;
  local_118.can_be_discovered_ = true;
  local_118.can_discover_ = true;
  local_118.port_ = 0x2ef5;
  local_118.multicast_group_address_ = 0xe000007b;
  local_118.application_id_ = 0x753584;
  local_118.send_timeout_ms_ = 100;
  local_118.can_use_broadcast_ = false;
  local_118.can_use_multicast_ = true;
  udpdiscovery::Peer::Peer(&local_d0);
  std::__cxx11::string::string((string *)local_140,"peer 1",(allocator *)local_b8);
  udpdiscovery::Peer::Start(&local_d0,&local_118,(string *)local_140);
  std::__cxx11::string::_M_dispose();
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer(&local_e8);
  std::__cxx11::string::string((string *)local_140,"peer 2",(allocator *)local_b8);
  udpdiscovery::Peer::Start(&local_e8,&local_118,(string *)local_140);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)local_b8,"peer 2",local_90);
  local_140._0_8_ = &local_d0;
  std::__cxx11::string::string((string *)(local_140 + 8),(string *)local_b8);
  std::__cxx11::string::_M_dispose();
  FindUserDataCallable::FindUserDataCallable(&local_48,(FindUserDataCallable *)local_140);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_48);
  std::__cxx11::string::_M_dispose();
  if (((uint3)WVar1 & 1) != 0) {
    __assert_fail("find1.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xa0,"void peer_udp_multicast_discovery()");
  }
  if (((uint3)WVar1 >> 8 & 1) == 0) {
    __assert_fail("find1.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xa1,"void peer_udp_multicast_discovery()");
  }
  std::__cxx11::string::string((string *)local_90,"peer 1",&local_141);
  local_b8._0_8_ = &local_e8;
  std::__cxx11::string::string((string *)(local_b8 + 8),(string *)local_90);
  std::__cxx11::string::_M_dispose();
  FindUserDataCallable::FindUserDataCallable(&local_70,(FindUserDataCallable *)local_b8);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_70);
  std::__cxx11::string::_M_dispose();
  if (((uint3)WVar1 & 1) != 0) {
    __assert_fail("find2.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xa7,"void peer_udp_multicast_discovery()");
  }
  if (((uint3)WVar1 >> 8 & 1) != 0) {
    udpdiscovery::Peer::StopAndWaitForThreads(&local_d0);
    udpdiscovery::Peer::StopAndWaitForThreads(&local_e8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    udpdiscovery::Peer::~Peer(&local_e8);
    udpdiscovery::Peer::~Peer(&local_d0);
    return;
  }
  __assert_fail("find2.has_result == true",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,0xa8,"void peer_udp_multicast_discovery()");
}

Assistant:

void peer_udp_multicast_discovery() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);
  peer_parameters.set_can_use_broadcast(false);
  peer_parameters.set_can_use_multicast(true);
  peer_parameters.set_multicast_group_address(kMulticastAddress);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> find1 =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(find1.is_timeout == false);
  assert(find1.has_result == true);

  FindUserDataCallable find_peer1(peer2, "peer 1");
  WaitResult<bool> find2 =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer1);
  assert(find2.is_timeout == false);
  assert(find2.has_result == true);

  peer1.StopAndWaitForThreads();
  peer2.StopAndWaitForThreads();
}